

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

timestamp_t
duckdb::TryCastCInternal<char*,duckdb::timestamp_t,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
          (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  timestamp_t result_value;
  timestamp_t local_10;
  
  bVar1 = FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,duckdb::timestamp_t>
                    (*(char **)((long)result->deprecated_columns[col].deprecated_data + row * 8),
                     &local_10);
  if (!bVar1) {
    local_10 = FetchDefaultValue::Operation<duckdb::timestamp_t>();
  }
  return (timestamp_t)local_10.value;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}